

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void prune_dead_connections(Curl_easy *data)

{
  conncache *pcVar1;
  time_t tVar2;
  timeval newer;
  time_t elapsed;
  timeval now;
  Curl_easy *data_local;
  
  newer = curlx_tvnow();
  tVar2 = curlx_tvdiff(newer,((data->state).conn_cache)->last_cleanup);
  if (999 < tVar2) {
    Curl_conncache_foreach((data->state).conn_cache,data,call_disconnect_if_dead);
    pcVar1 = (data->state).conn_cache;
    elapsed = newer.tv_sec;
    (pcVar1->last_cleanup).tv_sec = elapsed;
    now.tv_sec = newer.tv_usec;
    (pcVar1->last_cleanup).tv_usec = now.tv_sec;
  }
  return;
}

Assistant:

static void prune_dead_connections(struct Curl_easy *data)
{
  struct timeval now = Curl_tvnow();
  time_t elapsed = Curl_tvdiff(now, data->state.conn_cache->last_cleanup);

  if(elapsed >= 1000L) {
    Curl_conncache_foreach(data->state.conn_cache, data,
                           call_disconnect_if_dead);
    data->state.conn_cache->last_cleanup = now;
  }
}